

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heterogeneous_queue_basic_tests.cpp
# Opt level: O0

void density_tests::
     NbQueueBasicTests<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
     ::lf_heterogeneous_queue_basic_polymorphic_base_tests(void)

{
  bool bVar1;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  LfHeterQueue<RunTimeType> queue;
  reentrant_consume_operation local_248;
  int local_22c;
  consume_operation local_228;
  int local_20c;
  reentrant_consume_operation local_208;
  int local_1ec;
  consume_operation local_1e8;
  int local_1cc;
  reentrant_consume_operation local_1c8;
  int local_1ac;
  consume_operation local_1a8;
  reentrant_consume_operation local_190;
  consume_operation local_178;
  reentrant_consume_operation local_160;
  consume_operation local_148;
  PolymorphicBase local_120;
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  local_100;
  
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::lf_heter_queue(&local_100);
  local_120.m_double = 0.0;
  local_120._24_8_ = 0;
  local_120._vptr_PolymorphicBase = (_func_int **)0x0;
  local_120.super_NonPolymorphicBase = (NonPolymorphicBase)0x0;
  PolymorphicBase::PolymorphicBase(&local_120);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::push<density_tests::PolymorphicBase>(&local_100,&local_120);
  PolymorphicBase::~PolymorphicBase(&local_120);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::emplace<density_tests::SingleDerived>(&local_100);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::emplace<density_tests::Derived1>(&local_100);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::emplace<density_tests::Derived2>(&local_100);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::emplace<density_tests::MultipleDerived>(&local_100);
  NbQueueBasicTests<(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>
  ::
  dynamic_push_3<density_tests::PolymorphicBase,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>>
            (&local_100);
  NbQueueBasicTests<(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>
  ::
  dynamic_push_3<density_tests::SingleDerived,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>>
            (&local_100);
  NbQueueBasicTests<(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>
  ::
  dynamic_push_3<density_tests::Derived1,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>>
            (&local_100);
  NbQueueBasicTests<(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>
  ::
  dynamic_push_3<density_tests::Derived2,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>>
            (&local_100);
  NbQueueBasicTests<(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>
  ::
  dynamic_push_3<density_tests::MultipleDerived,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>>
            (&local_100);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::try_start_consume(&local_148,&local_100);
  polymorphic_consume<density_tests::PolymorphicBase,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>::consume_operation>
            (&local_148);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::consume_operation::~consume_operation(&local_148);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::try_start_reentrant_consume(&local_160,&local_100);
  polymorphic_consume<density_tests::SingleDerived,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>::reentrant_consume_operation>
            (&local_160);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_160);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::try_start_consume(&local_178,&local_100);
  polymorphic_consume<density_tests::Derived1,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>::consume_operation>
            (&local_178);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::consume_operation::~consume_operation(&local_178);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::try_start_reentrant_consume(&local_190,&local_100);
  polymorphic_consume<density_tests::Derived2,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>::reentrant_consume_operation>
            (&local_190);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_190);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::try_start_consume(&local_1a8,&local_100);
  polymorphic_consume<density_tests::MultipleDerived,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>::consume_operation>
            (&local_1a8);
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::consume_operation::~consume_operation(&local_1a8);
  for (local_1ac = 0; local_1ac < 3; local_1ac = local_1ac + 1) {
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    ::try_start_reentrant_consume(&local_1c8,&local_100);
    polymorphic_consume<density_tests::PolymorphicBase,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>::reentrant_consume_operation>
              (&local_1c8);
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    ::reentrant_consume_operation::~reentrant_consume_operation(&local_1c8);
  }
  for (local_1cc = 0; local_1cc < 3; local_1cc = local_1cc + 1) {
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    ::try_start_consume(&local_1e8,&local_100);
    polymorphic_consume<density_tests::SingleDerived,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>::consume_operation>
              (&local_1e8);
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    ::consume_operation::~consume_operation(&local_1e8);
  }
  for (local_1ec = 0; local_1ec < 3; local_1ec = local_1ec + 1) {
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    ::try_start_reentrant_consume(&local_208,&local_100);
    polymorphic_consume<density_tests::Derived1,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>::reentrant_consume_operation>
              (&local_208);
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    ::reentrant_consume_operation::~reentrant_consume_operation(&local_208);
  }
  for (local_20c = 0; local_20c < 3; local_20c = local_20c + 1) {
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    ::try_start_consume(&local_228,&local_100);
    polymorphic_consume<density_tests::Derived2,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>::consume_operation>
              (&local_228);
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    ::consume_operation::~consume_operation(&local_228);
  }
  for (local_22c = 0; local_22c < 3; local_22c = local_22c + 1) {
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    ::try_start_reentrant_consume(&local_248,&local_100);
    polymorphic_consume<density_tests::MultipleDerived,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>::reentrant_consume_operation>
              (&local_248);
    density::
    lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    ::reentrant_consume_operation::~reentrant_consume_operation(&local_248);
  }
  bVar1 = density::
          lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
          ::empty(&local_100);
  if (!bVar1) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/lf_heterogeneous_queue_basic_tests.cpp"
               ,0xcd);
  }
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::~lf_heter_queue(&local_100);
  return;
}

Assistant:

static void lf_heterogeneous_queue_basic_polymorphic_base_tests()
        {
            using namespace density;

            using RunTimeType = runtime_type<
              f_default_construct,
              f_move_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment>;
            LfHeterQueue<RunTimeType> queue;

            queue.push(PolymorphicBase());
            queue.template emplace<SingleDerived>();
            queue.template emplace<Derived1>();
            queue.template emplace<Derived2>();
            queue.template emplace<MultipleDerived>();

            dynamic_push_3<PolymorphicBase>(queue);
            dynamic_push_3<SingleDerived>(queue);
            dynamic_push_3<Derived1>(queue);
            dynamic_push_3<Derived2>(queue);
            dynamic_push_3<MultipleDerived>(queue);

            polymorphic_consume<PolymorphicBase>(queue.try_start_consume());
            polymorphic_consume<SingleDerived>(queue.try_start_reentrant_consume());
            polymorphic_consume<Derived1>(queue.try_start_consume());
            polymorphic_consume<Derived2>(queue.try_start_reentrant_consume());
            polymorphic_consume<MultipleDerived>(queue.try_start_consume());

            for (int i = 0; i < 3; i++)
                polymorphic_consume<PolymorphicBase>(queue.try_start_reentrant_consume());
            for (int i = 0; i < 3; i++)
                polymorphic_consume<SingleDerived>(queue.try_start_consume());
            for (int i = 0; i < 3; i++)
                polymorphic_consume<Derived1>(queue.try_start_reentrant_consume());
            for (int i = 0; i < 3; i++)
                polymorphic_consume<Derived2>(queue.try_start_consume());
            for (int i = 0; i < 3; i++)
                polymorphic_consume<MultipleDerived>(queue.try_start_reentrant_consume());

            DENSITY_TEST_ASSERT(queue.empty());
        }